

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular-array.h
# Opt level: O2

void __thiscall
wabt::CircularArray<(anonymous_namespace)::TestObject,_4UL>::push_back
          (CircularArray<(anonymous_namespace)::TestObject,_4UL> *this,value_type *value)

{
  ulong index;
  int iVar1;
  reference pvVar2;
  
  index = this->size_;
  if (index < 4) {
    this->size_ = index + 1;
    pvVar2 = at(this,index);
    if (pvVar2->moved == false) {
      ::(anonymous_namespace)::TestObject::destruct_count =
           ::(anonymous_namespace)::TestObject::destruct_count + 1;
    }
    pvVar2->moved = false;
    pvVar2->data = 0;
    pvVar2->data2 = 0;
    iVar1 = value->data2;
    pvVar2->data = value->data;
    pvVar2->data2 = iVar1;
    ::(anonymous_namespace)::TestObject::construct_count =
         ::(anonymous_namespace)::TestObject::construct_count + 1;
    return;
  }
  __assert_fail("size_ < kCapacity",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/include/wabt/circular-array.h"
                ,0x5d,
                "void wabt::CircularArray<(anonymous namespace)::TestObject, 4>::push_back(const value_type &) [T = (anonymous namespace)::TestObject, kCapacity = 4]"
               );
}

Assistant:

void push_back(const value_type& value) {
    assert(size_ < kCapacity);
    SetElement(at(size_++), value);
  }